

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int ncnn::reduction_op<std::plus<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  Allocator *pAVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int *piVar12;
  void *pvVar13;
  bool bVar14;
  long lVar15;
  void *pvVar16;
  long lVar17;
  void *pvVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  int unaff_R15D;
  float fVar23;
  void *ptr;
  Mat local_78;
  Allocator *local_38;
  
  sVar2 = a->elemsize;
  iVar1 = a->dims;
  if (iVar1 == 2) {
    uVar9 = a->w;
    uVar10 = (ulong)uVar9;
    iVar7 = a->h;
    lVar11 = (long)iVar7;
    if (reduce_w && reduce_h) {
      Mat::create(b,1,sVar2,opt->blob_allocator);
      local_38 = opt->workspace_allocator;
      if (iVar7 == 0) {
        piVar12 = (int *)0x0;
        pvVar13 = (void *)0x0;
      }
      else {
        uVar19 = sVar2 * lVar11 + 3 & 0xfffffffffffffffc;
        if (local_38 == (Allocator *)0x0) {
          local_78.data = (void *)0x0;
          iVar6 = posix_memalign(&local_78.data,0x10,uVar19 + 4);
          pvVar13 = local_78.data;
          if (iVar6 != 0) {
            local_78.data = (void *)0x0;
            pvVar13 = local_78.data;
          }
        }
        else {
          pvVar13 = (void *)(**(code **)(*(long *)local_38 + 0x10))(local_38,uVar19 + 4);
        }
        piVar12 = (int *)((long)pvVar13 + uVar19);
        *(undefined4 *)((long)pvVar13 + uVar19) = 1;
      }
      unaff_R15D = -100;
      if (iVar7 != 0 && pvVar13 != (void *)0x0) {
        if (0 < iVar7) {
          pvVar16 = a->data;
          iVar6 = a->w;
          sVar3 = a->elemsize;
          lVar15 = 0;
          do {
            fVar23 = 0.0;
            if (0 < (int)uVar9) {
              uVar19 = 0;
              do {
                fVar23 = fVar23 + *(float *)((long)pvVar16 + uVar19 * 4);
                uVar19 = uVar19 + 1;
              } while (uVar10 != uVar19);
            }
            *(float *)((long)pvVar13 + lVar15 * 4) = fVar23;
            lVar15 = lVar15 + 1;
            pvVar16 = (void *)((long)pvVar16 + (long)iVar6 * sVar3);
          } while (lVar15 != lVar11);
        }
        fVar23 = 0.0;
        if (0 < iVar7) {
          lVar15 = 0;
          do {
            fVar23 = fVar23 + *(float *)((long)pvVar13 + lVar15 * 4);
            lVar15 = lVar15 + 1;
          } while (lVar11 != lVar15);
        }
        *(float *)b->data = fVar23;
        unaff_R15D = 0;
      }
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_38 != (Allocator *)0x0) {
            (**(code **)(*(long *)local_38 + 0x18))(local_38,pvVar13);
            goto LAB_00144c05;
          }
          if (pvVar13 != (void *)0x0) {
            free(pvVar13);
          }
          bVar14 = false;
          goto LAB_00144c1d;
        }
      }
      bVar14 = false;
    }
    else if (reduce_w && !reduce_h) {
      Mat::create(b,iVar7,sVar2,opt->blob_allocator);
      if (0 < iVar7) {
        pvVar13 = a->data;
        iVar7 = a->w;
        pvVar16 = b->data;
        sVar3 = a->elemsize;
        lVar15 = 0;
        do {
          fVar23 = 0.0;
          if (0 < (int)uVar9) {
            uVar19 = 0;
            do {
              fVar23 = fVar23 + *(float *)((long)pvVar13 + uVar19 * 4);
              uVar19 = uVar19 + 1;
            } while (uVar10 != uVar19);
          }
          *(float *)((long)pvVar16 + lVar15 * 4) = fVar23;
          lVar15 = lVar15 + 1;
          pvVar13 = (void *)((long)pvVar13 + (long)iVar7 * sVar3);
        } while (lVar15 != lVar11);
        goto LAB_00144af0;
      }
      unaff_R15D = 0;
LAB_00144c05:
      bVar14 = false;
    }
    else if (reduce_h && !reduce_w) {
      Mat::create(b,uVar9,sVar2,opt->blob_allocator);
      uVar8 = b->c * (int)b->cstep;
      if (0 < (int)uVar8) {
        memset(b->data,0,(ulong)uVar8 << 2);
      }
      if (0 < iVar7) {
        pvVar13 = a->data;
        iVar7 = a->w;
        pvVar16 = b->data;
        sVar3 = a->elemsize;
        lVar15 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar19 = 0;
            do {
              *(float *)((long)pvVar16 + uVar19 * 4) =
                   *(float *)((long)pvVar13 + uVar19 * 4) + *(float *)((long)pvVar16 + uVar19 * 4);
              uVar19 = uVar19 + 1;
            } while (uVar10 != uVar19);
          }
          lVar15 = lVar15 + 1;
          pvVar13 = (void *)((long)pvVar13 + (long)iVar7 * sVar3);
        } while (lVar15 != lVar11);
      }
LAB_00144af0:
      bVar14 = false;
      unaff_R15D = 0;
    }
    else {
      bVar14 = true;
    }
LAB_00144c1d:
    if (!bVar14) {
      return unaff_R15D;
    }
  }
  else if (iVar1 == 1) {
    iVar1 = a->w;
    Mat::create(b,1,sVar2,opt->blob_allocator);
    if ((long)iVar1 < 1) {
      fVar23 = 0.0;
    }
    else {
      fVar23 = 0.0;
      lVar11 = 0;
      do {
        fVar23 = fVar23 + *(float *)((long)a->data + lVar11 * 4);
        lVar11 = lVar11 + 1;
      } while (iVar1 != lVar11);
    }
    *(float *)b->data = fVar23;
    return 0;
  }
  if (iVar1 != 3) {
    return 0;
  }
  uVar9 = a->w;
  uVar10 = (ulong)uVar9;
  uVar8 = a->h;
  uVar19 = (ulong)uVar8;
  iVar1 = a->c;
  lVar11 = (long)iVar1;
  uVar21 = uVar8 * uVar9;
  bVar14 = !reduce_w;
  if ((!bVar14 && reduce_h) && reduce_c) {
    Mat::create(b,1,sVar2,opt->blob_allocator);
    pAVar5 = opt->workspace_allocator;
    if (iVar1 == 0) {
      piVar12 = (int *)0x0;
      pvVar13 = (void *)0x0;
    }
    else {
      uVar10 = sVar2 * lVar11 + 3 & 0xfffffffffffffffc;
      if (pAVar5 == (Allocator *)0x0) {
        local_78.data = (void *)0x0;
        iVar7 = posix_memalign(&local_78.data,0x10,uVar10 + 4);
        pvVar13 = local_78.data;
        if (iVar7 != 0) {
          local_78.data = (void *)0x0;
          pvVar13 = local_78.data;
        }
      }
      else {
        pvVar13 = (void *)(**(code **)(*(long *)pAVar5 + 0x10))(pAVar5,uVar10 + 4);
      }
      piVar12 = (int *)((long)pvVar13 + uVar10);
      *(undefined4 *)((long)pvVar13 + uVar10) = 1;
    }
    unaff_R15D = -100;
    if (iVar1 != 0 && pvVar13 != (void *)0x0) {
      if (0 < iVar1) {
        pvVar16 = a->data;
        sVar2 = a->cstep;
        sVar3 = a->elemsize;
        lVar15 = 0;
        do {
          fVar23 = 0.0;
          if (0 < (int)uVar21) {
            uVar10 = 0;
            do {
              fVar23 = fVar23 + *(float *)((long)pvVar16 + uVar10 * 4);
              uVar10 = uVar10 + 1;
            } while (uVar21 != uVar10);
          }
          *(float *)((long)pvVar13 + lVar15 * 4) = fVar23;
          lVar15 = lVar15 + 1;
          pvVar16 = (void *)((long)pvVar16 + sVar2 * sVar3);
        } while (lVar15 != lVar11);
      }
      fVar23 = 0.0;
      if (0 < iVar1) {
        lVar15 = 0;
        do {
          fVar23 = fVar23 + *(float *)((long)pvVar13 + lVar15 * 4);
          lVar15 = lVar15 + 1;
        } while (lVar11 != lVar15);
      }
      *(float *)b->data = fVar23;
      unaff_R15D = 0;
    }
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar13 != (void *)0x0) {
            free(pvVar13);
          }
        }
        else {
          (**(code **)(*(long *)pAVar5 + 0x18))(pAVar5,pvVar13);
        }
      }
    }
LAB_00145315:
    bVar14 = false;
  }
  else {
    if ((!bVar14 && reduce_h) && !reduce_c) {
      Mat::create(b,iVar1,sVar2,opt->blob_allocator);
      if (0 < iVar1) {
        sVar2 = a->cstep;
        sVar3 = a->elemsize;
        pvVar13 = a->data;
        pvVar16 = b->data;
        lVar15 = 0;
        do {
          fVar23 = 0.0;
          if (0 < (int)uVar21) {
            uVar10 = 0;
            do {
              fVar23 = fVar23 + *(float *)((long)pvVar13 + uVar10 * 4);
              uVar10 = uVar10 + 1;
            } while (uVar21 != uVar10);
          }
          *(float *)((long)pvVar16 + lVar15 * 4) = fVar23;
          lVar15 = lVar15 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
        } while (lVar15 != lVar11);
      }
    }
    else {
      lVar15 = (long)(int)uVar9;
      if ((bVar14 || reduce_h) || reduce_c) {
        if ((!bVar14 && !reduce_h) && reduce_c) {
          Mat::create(b,uVar8,sVar2,opt->blob_allocator);
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.elempack = 0;
          local_78.data = (void *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.c = 0;
          local_78.cstep = 0;
          Mat::create(&local_78,1,uVar8,iVar1,sVar2,opt->workspace_allocator);
          unaff_R15D = -100;
          if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
            if (0 < local_78.c * (int)local_78.cstep) {
              memset(local_78.data,0,(ulong)(uint)(local_78.c * (int)local_78.cstep) << 2);
            }
            if (0 < iVar1) {
              pvVar13 = a->data;
              sVar2 = a->cstep;
              sVar3 = a->elemsize;
              lVar17 = 0;
              do {
                if (0 < (int)uVar8) {
                  uVar20 = 0;
                  pvVar16 = pvVar13;
                  do {
                    fVar23 = 0.0;
                    if (0 < (int)uVar9) {
                      uVar22 = 0;
                      do {
                        fVar23 = fVar23 + *(float *)((long)pvVar16 + uVar22 * 4);
                        uVar22 = uVar22 + 1;
                      } while (uVar10 != uVar22);
                    }
                    *(float *)((long)local_78.data +
                              uVar20 * 4 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                              lVar17) = fVar23;
                    uVar20 = uVar20 + 1;
                    pvVar16 = (void *)((long)pvVar16 + lVar15 * 4);
                  } while (uVar20 != uVar19);
                }
                lVar17 = lVar17 + 1;
                pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
              } while (lVar17 != lVar11);
            }
            uVar9 = b->c * (int)b->cstep;
            if (0 < (int)uVar9) {
              memset(b->data,0,(ulong)uVar9 << 2);
            }
            if (0 < iVar1) {
              pvVar13 = b->data;
              lVar15 = 0;
              pvVar16 = local_78.data;
              do {
                if (0 < (int)uVar8) {
                  uVar10 = 0;
                  do {
                    *(float *)((long)pvVar13 + uVar10 * 4) =
                         *(float *)((long)pvVar16 + uVar10 * 4) +
                         *(float *)((long)pvVar13 + uVar10 * 4);
                    uVar10 = uVar10 + 1;
                  } while (uVar19 != uVar10);
                }
                lVar15 = lVar15 + 1;
                pvVar16 = (void *)((long)pvVar16 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (lVar15 != lVar11);
            }
LAB_00145308:
            unaff_R15D = 0;
          }
        }
        else {
          if ((!reduce_h || reduce_w) || !reduce_c) {
            if ((!reduce_w && !reduce_h) && reduce_c) {
              Mat::create(b,uVar9,uVar8,sVar2,opt->blob_allocator);
              uVar9 = b->c * (int)b->cstep;
              if (0 < (int)uVar9) {
                memset(b->data,0,(ulong)uVar9 << 2);
              }
              if (0 < iVar1) {
                sVar2 = a->cstep;
                sVar3 = a->elemsize;
                pvVar13 = a->data;
                pvVar16 = b->data;
                lVar15 = 0;
                unaff_R15D = 0;
                do {
                  if (0 < (int)uVar21) {
                    uVar10 = 0;
                    do {
                      *(float *)((long)pvVar16 + uVar10 * 4) =
                           *(float *)((long)pvVar13 + uVar10 * 4) +
                           *(float *)((long)pvVar16 + uVar10 * 4);
                      uVar10 = uVar10 + 1;
                    } while (uVar21 != uVar10);
                  }
                  lVar15 = lVar15 + 1;
                  pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
                  bVar14 = false;
                } while (lVar15 != lVar11);
                goto LAB_00145317;
              }
            }
            else {
              bVar14 = true;
              if ((!reduce_h || reduce_w) || reduce_c) goto LAB_00145317;
              Mat::create(b,uVar9,iVar1,sVar2,opt->blob_allocator);
              uVar21 = b->c * (int)b->cstep;
              if (0 < (int)uVar21) {
                memset(b->data,0,(ulong)uVar21 << 2);
              }
              if (0 < iVar1) {
                pvVar13 = a->data;
                sVar2 = a->cstep;
                pvVar16 = b->data;
                iVar1 = b->w;
                sVar3 = b->elemsize;
                sVar4 = a->elemsize;
                lVar17 = 0;
                unaff_R15D = 0;
                do {
                  if (0 < (int)uVar8) {
                    uVar21 = 0;
                    pvVar18 = pvVar13;
                    do {
                      if (0 < (int)uVar9) {
                        uVar19 = 0;
                        do {
                          *(float *)((long)pvVar16 + uVar19 * 4) =
                               *(float *)((long)pvVar18 + uVar19 * 4) +
                               *(float *)((long)pvVar16 + uVar19 * 4);
                          uVar19 = uVar19 + 1;
                        } while (uVar10 != uVar19);
                      }
                      uVar21 = uVar21 + 1;
                      pvVar18 = (void *)((long)pvVar18 + lVar15 * 4);
                    } while (uVar21 != uVar8);
                  }
                  lVar17 = lVar17 + 1;
                  pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar4);
                  pvVar16 = (void *)((long)pvVar16 + (long)iVar1 * sVar3);
                  bVar14 = false;
                } while (lVar17 != lVar11);
                goto LAB_00145317;
              }
            }
            goto LAB_00144ee5;
          }
          Mat::create(b,uVar9,sVar2,opt->blob_allocator);
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.elempack = 0;
          local_78.data = (void *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.c = 0;
          local_78.cstep = 0;
          Mat::create(&local_78,uVar9,1,iVar1,sVar2,opt->workspace_allocator);
          unaff_R15D = -100;
          if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
            if (0 < local_78.c * (int)local_78.cstep) {
              memset(local_78.data,0,(ulong)(uint)(local_78.c * (int)local_78.cstep) << 2);
            }
            if (0 < iVar1) {
              pvVar13 = a->data;
              sVar2 = a->cstep;
              sVar3 = a->elemsize;
              lVar17 = 0;
              pvVar16 = local_78.data;
              do {
                if (0 < (int)uVar8) {
                  uVar21 = 0;
                  pvVar18 = pvVar13;
                  do {
                    if (0 < (int)uVar9) {
                      uVar19 = 0;
                      do {
                        *(float *)((long)pvVar16 + uVar19 * 4) =
                             *(float *)((long)pvVar18 + uVar19 * 4) +
                             *(float *)((long)pvVar16 + uVar19 * 4);
                        uVar19 = uVar19 + 1;
                      } while (uVar10 != uVar19);
                    }
                    uVar21 = uVar21 + 1;
                    pvVar18 = (void *)((long)pvVar18 + lVar15 * 4);
                  } while (uVar21 != uVar8);
                }
                lVar17 = lVar17 + 1;
                pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
                pvVar16 = (void *)((long)pvVar16 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (lVar17 != lVar11);
            }
            uVar8 = b->c * (int)b->cstep;
            if (0 < (int)uVar8) {
              memset(b->data,0,(ulong)uVar8 << 2);
            }
            if (0 < iVar1) {
              pvVar13 = b->data;
              lVar15 = 0;
              pvVar16 = local_78.data;
              do {
                if (0 < (int)uVar9) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar13 + uVar19 * 4) =
                         *(float *)((long)pvVar16 + uVar19 * 4) +
                         *(float *)((long)pvVar13 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar10 != uVar19);
                }
                lVar15 = lVar15 + 1;
                pvVar16 = (void *)((long)pvVar16 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (lVar15 != lVar11);
            }
            goto LAB_00145308;
          }
        }
        Mat::~Mat(&local_78);
        goto LAB_00145315;
      }
      Mat::create(b,uVar8,iVar1,sVar2,opt->blob_allocator);
      if (0 < iVar1) {
        pvVar13 = a->data;
        sVar2 = a->cstep;
        iVar1 = b->w;
        sVar3 = b->elemsize;
        sVar4 = a->elemsize;
        pvVar16 = b->data;
        lVar17 = 0;
        do {
          if (0 < (int)uVar8) {
            uVar20 = 0;
            pvVar18 = pvVar13;
            do {
              fVar23 = 0.0;
              if (0 < (int)uVar9) {
                uVar22 = 0;
                do {
                  fVar23 = fVar23 + *(float *)((long)pvVar18 + uVar22 * 4);
                  uVar22 = uVar22 + 1;
                } while (uVar10 != uVar22);
              }
              *(float *)((long)pvVar16 + uVar20 * 4 + lVar17 * (long)iVar1 * sVar3) = fVar23;
              uVar20 = uVar20 + 1;
              pvVar18 = (void *)((long)pvVar18 + lVar15 * 4);
            } while (uVar20 != uVar19);
          }
          lVar17 = lVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar4);
        } while (lVar17 != lVar11);
      }
    }
LAB_00144ee5:
    bVar14 = false;
    unaff_R15D = 0;
  }
LAB_00145317:
  if (bVar14) {
    return 0;
  }
  return unaff_R15D;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i=0; i<w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;
        
        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> X X
            b.create(1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i=0; i<h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> X h
            b.create(h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }
            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w X
            b.create(w, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);
                for (int j=0; j<w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }
            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> X X X
            b.create(1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i=0; i<channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> X X c
            b.create(channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                b[q] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> X h c
            b.create(h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> X h X
            b.create(h, elemsize, opt.blob_allocator);
            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }
            
            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i=0; i<h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w X X
            b.create(w, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j=0; j<w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h X
            b.create(w, h, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i=0; i<size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w X c
            b.create(w, channels, elemsize, opt.blob_allocator);
            
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }
            return 0;
        }
    }

    return 0;
}